

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_err.cpp
# Opt level: O0

void initErrorLine(void)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  reference pvVar4;
  int *piVar5;
  size_type sVar6;
  reference pTVar7;
  pointer pTVar8;
  bool local_39;
  __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_> local_28
  ;
  __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_> local_20
  ;
  __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_> local_18
  ;
  __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_> previous
  ;
  
  ErrorLine[0] = '\0';
  ErrorLine2[0] = '\0';
  if (((0 < pass) && (pass < 4)) &&
     (bVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::empty(&sourcePosStack), !bVar3
     )) {
    pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    pcVar2 = pvVar4->filename;
    pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
    snprintf(ErrorLine,0x1000,"%s(%d): ",pcVar2,(ulong)pvVar4->line);
    previous._M_current._4_4_ = 1;
    previous._M_current._0_4_ = IncludeLevel + 1;
    piVar5 = std::max<int>((int *)((long)&previous._M_current + 4),(int *)&previous);
    iVar1 = *piVar5;
    sVar6 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::size(&sourcePosStack);
    if (iVar1 < (int)sVar6) {
      local_20._M_current =
           (TextFilePos *)
           std::vector<TextFilePos,_std::allocator<TextFilePos>_>::end(&sourcePosStack);
      local_18 = __gnu_cxx::
                 __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
                 ::operator-(&local_20,2);
      pTVar7 = __gnu_cxx::
               __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
               ::operator*(&local_18);
      bVar3 = TextFilePos::operator==(pTVar7,&skipEmitMessagePos);
      local_39 = false;
      if (bVar3) {
        local_28._M_current =
             (TextFilePos *)
             std::vector<TextFilePos,_std::allocator<TextFilePos>_>::begin(&sourcePosStack);
        local_39 = __gnu_cxx::operator!=(&local_18,&local_28);
      }
      if (local_39 != false) {
        __gnu_cxx::
        __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>::
        operator--(&local_18);
      }
      pTVar7 = __gnu_cxx::
               __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
               ::operator*(&local_18);
      bVar3 = TextFilePos::operator!=(pTVar7,&skipEmitMessagePos);
      if (bVar3) {
        pTVar7 = __gnu_cxx::
                 __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
                 ::operator*(&local_18);
        pvVar4 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::back(&sourcePosStack);
        bVar3 = TextFilePos::operator!=(pTVar7,pvVar4);
        if (bVar3) {
          pTVar8 = __gnu_cxx::
                   __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
                   ::operator->(&local_18);
          pcVar2 = pTVar8->filename;
          pTVar8 = __gnu_cxx::
                   __normal_iterator<TextFilePos_*,_std::vector<TextFilePos,_std::allocator<TextFilePos>_>_>
                   ::operator->(&local_18);
          snprintf(ErrorLine2,0x1000,"%s(%d): ^ emitted from here\n",pcVar2,(ulong)pTVar8->line);
        }
      }
    }
  }
  return;
}

Assistant:

static void initErrorLine() {		// adds filename + line of definition if possible
	*ErrorLine = 0;
	*ErrorLine2 = 0;
	// when OpenFile is reporting error, the filename is still nullptr, but pass==1 already
	if (pass < 1 || LASTPASS < pass || sourcePosStack.empty()) return;
	SPRINTF2(ErrorLine, LINEMAX2, "%s(%d): ", sourcePosStack.back().filename, sourcePosStack.back().line);
	// if the error filename:line is not identical with current source line, add ErrorLine2 about emit
	if (std::max(1, aint(IncludeLevel + 1)) < aint(sourcePosStack.size())) {
		auto previous = sourcePosStack.end() - 2;
		if (*previous == skipEmitMessagePos && previous != sourcePosStack.begin()) --previous;
		if (*previous != skipEmitMessagePos && *previous != sourcePosStack.back()) {
			SPRINTF2(ErrorLine2, LINEMAX2, "%s(%d): ^ emitted from here\n", previous->filename, previous->line);
		}
	}
}